

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeBenchmark.cpp
# Opt level: O2

void __thiscall TreeBenchmark::TreeBenchmark(TreeBenchmark *this,unsigned_long vertices)

{
  DynamicGraph *v;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  vertex_descriptor u;
  Vertex i;
  boost *this_00;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_50;
  
  Benchmark::Benchmark(&this->super_Benchmark);
  (this->super_Benchmark)._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_0011fcf0;
  v = &(this->super_Benchmark).G;
  this_00 = (boost *)0x0;
  for (u = 1; (this_00 <= vertices && (u <= vertices)); u = u + 2) {
    boost::
    add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_50,this_00,u,(vertex_descriptor)v,in_R8);
    if (vertices < u + 1) {
      return;
    }
    boost::
    add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_50,this_00,u + 1,(vertex_descriptor)v,in_R8);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

TreeBenchmark::TreeBenchmark(unsigned long vertices)
{
    int offset = 1;
    for (Vertex i=0; i<=vertices; ++i) {
        if (offset+i > vertices) {
            break;
        }
        add_edge(i, i+offset, G);
        offset++;
        if (offset+i > vertices) {
            break;
        }
        add_edge(i, i+offset, G);
    }
}